

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping_padding.cpp
# Opt level: O2

void test_2d_static<5ul,5ul,1ul,1ul,30ul,30ul>(void)

{
  undefined4 uVar1;
  long lVar2;
  int iVar3;
  int i_1;
  char *pcVar4;
  unsigned_long *puVar5;
  int i;
  long lVar6;
  unsigned_long *local_f78;
  long local_f70;
  size_t true_idx;
  unsigned_long *local_f60;
  int *local_f58;
  ulong local_f50;
  unsigned_long *local_f48;
  ulong local_f40;
  int dptr [961];
  
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x26,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)dptr,(bool *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x28,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 0x1f;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x29,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 900;
  dptr[1] = 0;
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x2b,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x3c1;
  dptr[1] = 0;
  true_idx = 0x3c1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x2c,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,&true_idx);
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x34,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)dptr,(bool *)&true_idx);
  dptr[0] = 5;
  dptr[1] = 0;
  true_idx = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x36,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x97;
  dptr[1] = 0;
  true_idx = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x37,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x24;
  dptr[1] = 0;
  true_idx = 0x24;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x39,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x3c1;
  dptr[1] = 0;
  true_idx = 0x3c1;
  puVar5 = (unsigned_long *)dptr;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x3a,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,puVar5,&true_idx);
  local_f70 = 0;
  lVar2 = 0;
  while (lVar2 != 0x1e) {
    local_f60 = puVar5;
    local_f50 = lVar2;
    for (lVar6 = 0; lVar6 != 0x1e; lVar6 = lVar6 + 1) {
      local_f78 = (unsigned_long *)(local_f70 + lVar6);
      true_idx = (size_t)local_f78;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x44,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_f78,&true_idx);
      local_f58 = dptr + true_idx;
      local_f78 = puVar5;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x46,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_f78,&local_f58);
      *(undefined4 *)puVar5 = 0x2a;
      local_f78 = (unsigned_long *)CONCAT44(local_f78._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x4a,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)puVar5,(int *)&local_f78);
      puVar5 = (unsigned_long *)((long)puVar5 + 4);
    }
    local_f70 = local_f70 + 0x1f;
    puVar5 = (unsigned_long *)((long)local_f60 + 0x7c);
    lVar2 = local_f50 + 1;
  }
  puVar5 = (unsigned_long *)dptr;
  lVar2 = 0;
  local_f70 = 0;
  do {
    if (local_f70 == 0x1f) {
      puVar5 = (unsigned_long *)dptr;
      local_f70 = 0;
      lVar2 = 0;
      for (local_f50 = 0; local_f50 != 6; local_f50 = local_f50 + 1) {
        local_f60 = puVar5;
        for (lVar6 = 0; lVar6 != 0x1e; lVar6 = lVar6 + 5) {
          true_idx = local_f70 + lVar6;
          local_f78 = (unsigned_long *)(lVar2 + lVar6);
          boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                    ("(sub_l.index(i, j))","true_idx",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                     ,0x70,
                     "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,(unsigned_long *)&local_f78,&true_idx);
          local_f58 = dptr + true_idx;
          local_f78 = puVar5;
          boost::detail::test_eq_impl<int*,int*>
                    ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                     ,0x72,
                     "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,(int **)&local_f78,&local_f58);
          *(int *)puVar5 = 0x47;
          local_f78 = (unsigned_long *)CONCAT44(local_f78._4_4_,0x47);
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[sub_l.index(i, j)])","71",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                     ,0x76,
                     "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,(int *)puVar5,(int *)&local_f78);
          puVar5 = (unsigned_long *)((long)puVar5 + 0x14);
        }
        puVar5 = (unsigned_long *)((long)local_f60 + 0x25c);
        lVar2 = lVar2 + 0x97;
        local_f70 = local_f70 + 0x9b;
      }
      puVar5 = (unsigned_long *)dptr;
      local_f60 = (unsigned_long *)0x0;
      for (local_f50 = 0; local_f50 != 0x1f; local_f50 = local_f50 + 1) {
        local_f70 = 0;
        local_f40 = local_f50 % 5;
        local_f48 = puVar5;
        for (lVar2 = 0; lVar2 != 0x1f; lVar2 = lVar2 + 1) {
          local_f78 = (unsigned_long *)((long)local_f60 + lVar2);
          true_idx = (size_t)local_f78;
          boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                    ("(l.index(i, j))","true_idx",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                     ,0x7f,
                     "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,(unsigned_long *)&local_f78,&true_idx);
          local_f58 = dptr + true_idx;
          local_f78 = puVar5;
          boost::detail::test_eq_impl<int*,int*>
                    ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                     ,0x81,
                     "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,(int **)&local_f78,&local_f58);
          lVar6 = local_f70;
          if (lVar2 == 0x1e) {
            local_f78 = (unsigned_long *)CONCAT44(local_f78._4_4_,0x11);
            boost::detail::test_eq_impl<int,int>
                      ("(dptr[l.index(i, j)])","17",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                       ,0x86,
                       "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                       ,(int *)puVar5,(int *)&local_f78);
          }
          else if (local_f50 == 0x1e) {
            local_f78 = (unsigned_long *)CONCAT44(local_f78._4_4_,0x18);
            boost::detail::test_eq_impl<int,int>
                      ("(dptr[l.index(i, j)])","24",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                       ,0x8c,
                       "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                       ,(int *)puVar5,(int *)&local_f78);
          }
          else {
            if ((local_f40 == 0) &&
               ((char)((char)(((ushort)lVar2 & 0xff) / 5) * '\x05' + (char)local_f70) == '\0')) {
              local_f78 = (unsigned_long *)CONCAT44(local_f78._4_4_,0x47);
              pcVar4 = "71";
              iVar3 = 0x97;
            }
            else {
              local_f78 = (unsigned_long *)CONCAT44(local_f78._4_4_,0x2a);
              pcVar4 = "42";
              iVar3 = 0x9c;
            }
            boost::detail::test_eq_impl<int,int>
                      ("(dptr[l.index(i, j)])",pcVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                       ,iVar3,
                       "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                       ,(int *)puVar5,(int *)&local_f78);
            local_f70 = lVar6;
          }
          local_f70 = CONCAT71((int7)((ulong)local_f70 >> 8),(char)local_f70 + -1);
          puVar5 = (unsigned_long *)((long)puVar5 + 4);
        }
        local_f60 = (unsigned_long *)((long)local_f60 + 0x1f);
        puVar5 = (unsigned_long *)((long)local_f48 + 0x7c);
      }
      return;
    }
    local_f60 = puVar5;
    for (lVar6 = 0; lVar6 != 0x1f; lVar6 = lVar6 + 1) {
      local_f78 = (unsigned_long *)(lVar2 + lVar6);
      true_idx = (size_t)local_f78;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x53,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_f78,&true_idx);
      local_f58 = dptr + true_idx;
      local_f78 = puVar5;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x55,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_f78,&local_f58);
      if (lVar6 == 0x1e) {
        uVar1 = 0x11;
        *(int *)puVar5 = 0x11;
        pcVar4 = "17";
        iVar3 = 0x5c;
LAB_0010606d:
        local_f78 = (unsigned_long *)CONCAT44(local_f78._4_4_,uVar1);
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])",pcVar4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,iVar3,
                   "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)puVar5,(int *)&local_f78);
      }
      else if (local_f70 == 0x1e) {
        uVar1 = 0x18;
        *(int *)puVar5 = 0x18;
        pcVar4 = "24";
        iVar3 = 100;
        goto LAB_0010606d;
      }
      puVar5 = (unsigned_long *)((long)puVar5 + 4);
    }
    local_f70 = local_f70 + 1;
    lVar2 = lVar2 + 0x1f;
    puVar5 = (unsigned_long *)((long)local_f60 + 0x7c);
  } while( true );
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % StepX), "X must be divisable by StepX");
    static_assert(0 == (Y % StepY), "Y must be divisable by StepY");

    layout_mapping_left<
        dimensions<X, Y>
      , dimensions<1, 1>
      , dimensions<PadX, PadY>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_left<
        dimensions<X / StepX, Y / StepY>
      , dimensions<StepX, StepY>
      , dimensions<PadX, PadY>
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    int dptr[(X + PadX) * (Y + PadY)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.pads();
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0] + p[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.steps()[0]))
               && (0 == (j % sub_l.steps()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
            }
        }
    }
}